

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O2

void __thiscall
icu_63::SpoofImpl::getNumerics
          (SpoofImpl *this,UnicodeString *input,UnicodeSet *result,UErrorCode *param_3)

{
  short sVar1;
  int8_t iVar2;
  int iVar3;
  uint c;
  int32_t offset;
  double dVar4;
  
  UnicodeSet::clear(result);
  offset = 0;
  while( true ) {
    sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (input->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 <= offset) break;
    c = UnicodeString::char32At(input,offset);
    iVar2 = u_charType_63(c);
    if (iVar2 == '\t') {
      dVar4 = u_getNumericValue_63(c);
      UnicodeSet::add(result,c - (int)dVar4);
    }
    offset = (offset - (uint)(c < 0x10000)) + 2;
  }
  return;
}

Assistant:

void SpoofImpl::getNumerics(const UnicodeString& input, UnicodeSet& result, UErrorCode& /*status*/) const {
    result.clear();

    UChar32 codePoint;
    for (int32_t i = 0; i < input.length(); i += U16_LENGTH(codePoint)) {
        codePoint = input.char32At(i);

        // Store a representative character for each kind of decimal digit
        if (u_charType(codePoint) == U_DECIMAL_DIGIT_NUMBER) {
            // Store the zero character as a representative for comparison.
            // Unicode guarantees it is codePoint - value
            result.add(codePoint - (UChar32)u_getNumericValue(codePoint));
        }
    }
}